

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_insert.cpp
# Opt level: O3

void __thiscall
duckdb::Binder::BindDoUpdateSetExpressions
          (Binder *this,string *table_alias,LogicalInsert *insert,UpdateSetInfo *set_info,
          TableCatalogEntry *table,TableStorageInfo *storage_info)

{
  pointer pPVar1;
  pointer pPVar2;
  iterator __position;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> _Var3;
  pointer pIVar4;
  pointer pcVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  undefined1 auVar8 [8];
  undefined1 auVar9 [8];
  undefined8 uVar10;
  bool bVar11;
  reference name;
  LogicalType *pLVar12;
  ColumnDefinition *pCVar13;
  __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
  _Var14;
  column_t *__args;
  pointer pPVar15;
  reference __k;
  const_iterator cVar16;
  string *psVar17;
  BinderException *pBVar18;
  size_type __n;
  size_type __n_00;
  _Hash_node_base *p_Var19;
  IndexInfo *index;
  pointer pIVar20;
  vector<unsigned_long,_true> logical_column_ids;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  indexed_columns;
  vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  lambda_params;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  vector<unsigned_long,_true> local_1b8;
  ColumnDefinition *local_198;
  optional_ptr<duckdb::LogicalType,_true> local_190;
  UpdateSetInfo *local_188;
  reference local_180;
  undefined1 local_178 [8];
  undefined1 local_170 [8];
  LogicalType local_168;
  float local_150;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> local_148;
  Binder *apBStack_140 [7];
  vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_108;
  TableStorageInfo *local_e8;
  vector<duckdb::PhysicalIndex,_true> *local_e0;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_d8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *local_d0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_c0;
  string *local_b8;
  Binder *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (unsigned_long *)0x0;
  local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (unsigned_long *)0x0;
  local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  local_98 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_188 = set_info;
  local_e8 = storage_info;
  local_b8 = table_alias;
  local_b0 = this;
  if ((set_info->columns).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (set_info->columns).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_c0 = &set_info->columns;
    local_c8 = &set_info->expressions;
    local_e0 = &insert->set_columns;
    local_d0 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &insert->set_types;
    local_d8 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&(insert->super_LogicalOperator).expressions;
    __n_00 = 0;
    do {
      name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](local_c0,__n_00);
      pLVar12 = (LogicalType *)
                vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[](local_c8,__n_00);
      bVar11 = TableCatalogEntry::ColumnExists(table,name);
      local_190.ptr = pLVar12;
      if (!bVar11) {
        pBVar18 = (BinderException *)__cxa_allocate_exception(0x10);
        local_170 = (undefined1  [8])&local_168.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"Referenced update column %s not found in table!","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar5 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar5,pcVar5 + name->_M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar18,(string *)local_170,&local_50);
        __cxa_throw(pBVar18,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_180 = name;
      pCVar13 = TableCatalogEntry::GetColumn(table,name);
      bVar11 = ColumnDefinition::Generated(pCVar13);
      local_198 = pCVar13;
      if (bVar11) {
        pBVar18 = (BinderException *)__cxa_allocate_exception(0x10);
        local_170 = (undefined1  [8])&local_168.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"Cant update column \"%s\" because it is a generated column!"
                   ,"");
        psVar17 = ColumnDefinition::Name_abi_cxx11_(local_198);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar5 = (psVar17->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar5,pcVar5 + psVar17->_M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar18,(string *)local_170,&local_70);
        __cxa_throw(pBVar18,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar1 = (insert->set_columns).
               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (insert->set_columns).
               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_170 = (undefined1  [8])ColumnDefinition::Physical(pCVar13);
      _Var14 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<duckdb::PhysicalIndex*,std::vector<duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::PhysicalIndex_const>>
                         (pPVar1,pPVar2,(ExpressionBinder *)local_170);
      pCVar13 = local_198;
      if (_Var14._M_current !=
          (insert->set_columns).
          super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
          super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pBVar18 = (BinderException *)__cxa_allocate_exception(0x10);
        local_170 = (undefined1  [8])&local_168.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"Multiple assignments to same column \"%s\"","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar5 = (local_180->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar5,pcVar5 + local_180->_M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar18,(string *)local_170,&local_90);
        __cxa_throw(pBVar18,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pLVar12 = ColumnDefinition::Type(local_198);
      bVar11 = LogicalType::SupportsRegularUpdate(pLVar12);
      if (!bVar11) {
        insert->update_is_del_and_insert = true;
      }
      local_170 = (undefined1  [8])ColumnDefinition::Physical(pCVar13);
      __position._M_current =
           (insert->set_columns).
           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (insert->set_columns).
          super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
          super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::
        _M_realloc_insert<duckdb::PhysicalIndex>
                  (&local_e0->
                    super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>,
                   __position,(PhysicalIndex *)local_170);
      }
      else {
        (__position._M_current)->index = (idx_t)local_170;
        (insert->set_columns).
        super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
        super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __args = ColumnDefinition::Oid(pCVar13);
      if (local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1b8,
                   (iterator)
                   local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        *local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = *__args;
        local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pLVar12 = ColumnDefinition::Type(pCVar13);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (local_d0,pLVar12);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a8,local_180);
      pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)local_190.ptr);
      if ((pPVar15->super_BaseExpression).type == VALUE_DEFAULT) {
        ExpandDefaultExpression((duckdb *)local_170,pCVar13);
        auVar8 = local_170;
        local_170 = (undefined1  [8])0x0;
        auVar9 = local_170;
        _Var3._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             *(tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> *)
              local_190.ptr;
        local_170[0] = auVar8[0];
        local_170[1] = auVar8[1];
        local_170._2_6_ = auVar8._2_6_;
        (local_190.ptr)->id_ = local_170[0];
        (local_190.ptr)->physical_type_ = local_170[1];
        *(undefined6 *)&(local_190.ptr)->field_0x2 = local_170._2_6_;
        local_170 = auVar9;
        if (_Var3._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             )0x0) {
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        if (local_170 != (undefined1  [8])0x0) {
          (*((BaseExpression *)local_170)->_vptr_BaseExpression[1])();
        }
      }
      UpdateBinder::UpdateBinder((UpdateBinder *)local_170,local_b0,local_b0->context);
      pLVar12 = ColumnDefinition::Type(pCVar13);
      uVar10 = local_168._0_8_;
      if (&local_168 != pLVar12) {
        uVar6 = pLVar12->id_;
        uVar7 = pLVar12->physical_type_;
        local_168.physical_type_ = uVar7;
        local_168.id_ = uVar6;
        local_168._2_6_ = SUB86(uVar10,2);
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&local_168.type_info_,&pLVar12->type_info_);
      }
      result_type.ptr = local_190.ptr;
      local_108.
      super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ExpressionBinder::DoUpdateSetQualify
                ((ExpressionBinder *)local_170,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_190.ptr,local_b8,
                 (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                  *)&local_108);
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_178,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_170,result_type,false);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                (local_d8,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_178);
      if (local_178 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_178 + 8))();
      }
      ::std::
      vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_108);
      ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_170);
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)(local_188->columns).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_188->columns).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_170 = (undefined1  [8])apBStack_140;
  local_168._0_8_ = &DAT_00000001;
  local_168.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_168.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_150 = 1.0;
  local_148.ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
  apBStack_140[0] = (Binder *)0x0;
  pIVar20 = (local_e8->index_info).
            super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
            super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar4 = (local_e8->index_info).
           super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
           super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pIVar20 != pIVar4) {
    do {
      for (p_Var19 = (pIVar20->column_set)._M_h._M_before_begin._M_nxt;
          p_Var19 != (_Hash_node_base *)0x0; p_Var19 = p_Var19->_M_nxt) {
        local_108.
        super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_170;
        ::std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_170,p_Var19 + 1,&local_108);
      }
      pIVar20 = pIVar20 + 1;
    } while (pIVar20 != pIVar4);
  }
  if (local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      __k = vector<unsigned_long,_true>::operator[](&local_1b8,__n);
      cVar16 = ::std::
               _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_170,__k);
      if (cVar16.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
        insert->update_is_del_and_insert = true;
        break;
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)local_1b8.
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1b8.
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_170);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a8);
  if (local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_1b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Binder::BindDoUpdateSetExpressions(const string &table_alias, LogicalInsert &insert, UpdateSetInfo &set_info,
                                        TableCatalogEntry &table, TableStorageInfo &storage_info) {
	D_ASSERT(insert.children.size() == 1);

	vector<column_t> logical_column_ids;
	vector<string> column_names;
	D_ASSERT(set_info.columns.size() == set_info.expressions.size());

	for (idx_t i = 0; i < set_info.columns.size(); i++) {
		auto &colname = set_info.columns[i];
		auto &expr = set_info.expressions[i];
		if (!table.ColumnExists(colname)) {
			throw BinderException("Referenced update column %s not found in table!", colname);
		}
		auto &column = table.GetColumn(colname);
		if (column.Generated()) {
			throw BinderException("Cant update column \"%s\" because it is a generated column!", column.Name());
		}
		if (std::find(insert.set_columns.begin(), insert.set_columns.end(), column.Physical()) !=
		    insert.set_columns.end()) {
			throw BinderException("Multiple assignments to same column \"%s\"", colname);
		}

		if (!column.Type().SupportsRegularUpdate()) {
			insert.update_is_del_and_insert = true;
		}

		insert.set_columns.push_back(column.Physical());
		logical_column_ids.push_back(column.Oid());
		insert.set_types.push_back(column.Type());
		column_names.push_back(colname);
		if (expr->GetExpressionType() == ExpressionType::VALUE_DEFAULT) {
			expr = ExpandDefaultExpression(column);
		}

		// Qualify and bind the ON CONFLICT DO UPDATE SET expression.
		UpdateBinder update_binder(*this, context);
		update_binder.target_type = column.Type();

		// Avoid ambiguity between existing table columns and EXCLUDED columns.
		vector<unordered_set<string>> lambda_params;
		update_binder.DoUpdateSetQualify(expr, table_alias, lambda_params);

		auto bound_expr = update_binder.Bind(expr);
		D_ASSERT(bound_expr);
		insert.expressions.push_back(std::move(bound_expr));
	}

	// Figure out which columns are indexed on
	unordered_set<column_t> indexed_columns;
	for (auto &index : storage_info.index_info) {
		for (auto &column_id : index.column_set) {
			indexed_columns.insert(column_id);
		}
	}

	// If any column targeted by a SET expression has an index, then
	// we need to rewrite this to an DELETE + INSERT.
	for (idx_t i = 0; i < logical_column_ids.size(); i++) {
		auto &column = logical_column_ids[i];
		if (indexed_columns.count(column)) {
			insert.update_is_del_and_insert = true;
			break;
		}
	}
}